

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

iterator __thiscall
pstd::vector<pbrt::Shape,pstd::pmr::polymorphic_allocator<pbrt::Shape>>::insert<pbrt::Shape*>
          (vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *this,
          const_iterator pos,Shape *first,Shape *last)

{
  iterator pSVar1;
  size_t sVar2;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *in_RCX;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *in_RDX;
  iterator in_RSI;
  vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *in_RDI;
  Shape *iter;
  size_t firstOffset;
  char *in_stack_00000068;
  int in_stack_00000074;
  char *in_stack_00000078;
  LogLevel in_stack_00000084;
  
  pSVar1 = vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::end(in_RDI);
  if (in_RSI == pSVar1) {
    sVar2 = vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::size(in_RDI);
    for (; in_RDX != in_RCX;
        in_RDX = (vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_> *)&in_RDX->ptr
        ) {
      vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::push_back(in_RDX,in_RSI);
    }
    pSVar1 = vector<pbrt::Shape,_pstd::pmr::polymorphic_allocator<pbrt::Shape>_>::begin(in_RDI);
    return pSVar1 + sVar2;
  }
  pbrt::LogFatal(in_stack_00000084,in_stack_00000078,in_stack_00000074,in_stack_00000068);
}

Assistant:

iterator insert(const_iterator pos, InputIt first, InputIt last) {
        if (pos == end()) {
            size_t firstOffset = size();
            for (auto iter = first; iter != last; ++iter)
                push_back(*iter);
            return begin() + firstOffset;
        } else
            LOG_FATAL("TODO");
    }